

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O2

void __thiscall
ot::commissioner::CommissionerImpl::GetActiveDataset
          (CommissionerImpl *this,Handler<ActiveOperationalDataset> *aHandler,uint16_t aDatasetFlags
          )

{
  function<void_(const_ot::commissioner::ActiveOperationalDataset_*,_ot::commissioner::Error)>
  *this_00;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  anon_class_32_1_d0c21527 rawDatasetHandler;
  
  std::function<void_(const_ot::commissioner::ActiveOperationalDataset_*,_ot::commissioner::Error)>
  ::function(&rawDatasetHandler.aHandler,aHandler);
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  this_00 = (function<void_(const_ot::commissioner::ActiveOperationalDataset_*,_ot::commissioner::Error)>
             *)operator_new(0x20);
  std::function<void_(const_ot::commissioner::ActiveOperationalDataset_*,_ot::commissioner::Error)>
  ::function(this_00,&rawDatasetHandler.aHandler);
  pcStack_40 = std::
               _Function_handler<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp:457:30)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp:457:30)>
             ::_M_manager;
  local_58._M_unused._M_object = this_00;
  (*(this->super_Commissioner)._vptr_Commissioner[0x1b])(this,&local_58,(ulong)aDatasetFlags);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  std::_Function_base::~_Function_base((_Function_base *)&rawDatasetHandler);
  return;
}

Assistant:

void CommissionerImpl::GetActiveDataset(Handler<ActiveOperationalDataset> aHandler, uint16_t aDatasetFlags)
{
    auto rawDatasetHandler = [aHandler](const ByteArray *aRawDataset, Error aError) {
        Error                    error;
        ActiveOperationalDataset dataset;

        SuccessOrExit(error = aError);
        SuccessOrExit(error = DecodeActiveOperationalDataset(dataset, *aRawDataset));

        aHandler(&dataset, error);
    exit:
        if (error != ErrorCode::kNone)
        {
            aHandler(nullptr, error);
        }
    };

    GetRawActiveDataset(rawDatasetHandler, aDatasetFlags);
}